

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O0

Fl_Tree_Item * __thiscall Fl_Tree_Item::find_child_item(Fl_Tree_Item *this,char **arr)

{
  int iVar1;
  Fl_Tree_Item *pFVar2;
  char *pcVar3;
  int local_24;
  int t;
  char **arr_local;
  Fl_Tree_Item *this_local;
  
  local_24 = 0;
  do {
    iVar1 = children(this);
    if (iVar1 <= local_24) {
      return (Fl_Tree_Item *)0x0;
    }
    pFVar2 = child(this,local_24);
    pcVar3 = label(pFVar2);
    if (pcVar3 != (char *)0x0) {
      pFVar2 = child(this,local_24);
      pcVar3 = label(pFVar2);
      iVar1 = strcmp(pcVar3,*arr);
      if (iVar1 == 0) {
        if (arr[1] != (char *)0x0) {
          pFVar2 = Fl_Tree_Item_Array::operator[](&this->_children,local_24);
          pFVar2 = find_child_item(pFVar2,arr + 1);
          return pFVar2;
        }
        pFVar2 = Fl_Tree_Item_Array::operator[](&this->_children,local_24);
        return pFVar2;
      }
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

const Fl_Tree_Item *Fl_Tree_Item::find_child_item(char **arr) const {
  for ( int t=0; t<children(); t++ ) {
    if ( child(t)->label() ) {
      if ( strcmp(child(t)->label(), *arr) == 0 ) {	// match?
        if ( *(arr+1) ) {				// more in arr? descend
          return(_children[t]->find_child_item(arr+1));
        } else {					// end of arr? done
          return(_children[t]);
        }
      }
    }
  }
  return(0);
}